

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# charmap.cpp
# Opt level: O0

size_t __thiscall
CCharmapToUniSB::map(CCharmapToUniSB *this,char **outp,size_t *outlen,char *inp,size_t inlen)

{
  wchar_t ch;
  size_t sVar1;
  size_t sVar2;
  byte *in_RCX;
  ulong *in_RDX;
  long *in_RSI;
  long in_RDI;
  long in_R8;
  size_t csiz;
  wchar_t uni;
  size_t tot_outlen;
  size_t local_30;
  long local_28;
  byte *local_20;
  
  local_30 = 0;
  local_20 = in_RCX;
  for (local_28 = in_R8; local_28 != 0; local_28 = local_28 + -1) {
    ch = *(wchar_t *)(in_RDI + 0x20c + (ulong)*local_20 * 4);
    sVar1 = utf8_ptr::s_wchar_size(ch);
    local_30 = sVar1 + local_30;
    if (*in_RDX < sVar1) {
      *in_RDX = 0;
    }
    else {
      sVar2 = utf8_ptr::s_putch((char *)*in_RSI,ch);
      *in_RSI = sVar2 + *in_RSI;
      *in_RDX = *in_RDX - sVar1;
    }
    local_20 = local_20 + 1;
  }
  return local_30;
}

Assistant:

size_t CCharmapToUniSB::map(char **outp, size_t *outlen,
                            const char *inp, size_t inlen) const
{
    size_t tot_outlen;

    /* we haven't written any characters to the output buffer yet */
    tot_outlen = 0;

    /* scan each character (character == byte) in the input string */
    for ( ; inlen > 0 ; --inlen, ++inp)
    {
        wchar_t uni;
        size_t csiz;
        
        /* get the unicode mapping for this character */
        uni = map_[(unsigned char)*inp];

        /* get the size of this character */
        csiz = utf8_ptr::s_wchar_size(uni);

        /* add it to the total output lenght */
        tot_outlen += csiz;

        /* if there's room, add it to our output buffer */
        if (*outlen >= csiz)
        {
            /* write it out */
            *outp += utf8_ptr::s_putch(*outp, uni);
            
            /* deduct it from the remaining output length */
            *outlen -= csiz;
        }
        else
        {
            /* there's no room - set the remaining output length to zero */
            *outlen = 0;
        }
    }

    /* return the total output length */
    return tot_outlen;
}